

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O3

Frame * __thiscall Frame::prepend(Frame *this,void *data,size_t size)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  size_t sVar2;
  _Head_base<0UL,_unsigned_char_*,_false> _Var3;
  ulong uVar4;
  pointer __old_p;
  uint8_t *__dest;
  ulong uVar5;
  
  _Var1._M_head_impl =
       (this->m_Data)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar5 = (long)this->m_Pos - (long)_Var1._M_head_impl;
  if (uVar5 < size) {
    sVar2 = this->m_Size;
    uVar4 = sVar2 + size;
    _Var3._M_head_impl = (uchar *)operator_new__(uVar4);
    this->m_Pos = _Var3._M_head_impl + size + uVar5;
    memcpy(_Var3._M_head_impl + size + uVar5,_Var1._M_head_impl + uVar5,sVar2 - uVar5);
    (this->m_Data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var1._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Var1._M_head_impl);
      _Var3._M_head_impl =
           (this->m_Data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      uVar4 = this->m_Size + size;
    }
    this->m_Size = uVar4;
    this->m_OriginalSize = uVar4;
    __dest = _Var3._M_head_impl + uVar5;
  }
  else {
    __dest = this->m_Pos + -size;
  }
  this->m_Pos = __dest;
  memcpy(__dest,data,size);
  return this;
}

Assistant:

Frame& Frame::prepend(const void* const data, const size_t size)
{
    const size_t bytesFree = m_Pos - m_Data.get();
    if (size > bytesFree) {
        auto newData = new uint8_t[size + m_Size];

        m_Pos = newData + bytesFree + size;
        memcpy(m_Pos, m_Data.get() + bytesFree, m_Size - bytesFree);
        m_Data.reset(newData);
        m_Size += size;
        m_OriginalSize = m_Size;
        m_Pos = m_Data.get() + bytesFree;
    } else {
        m_Pos -= size;
    }
    memcpy(m_Pos, data, size);
    return *this;
}